

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Entry * __thiscall
kj::Table<const_void_*,_kj::HashIndex<kj::_::HashSetCallbacks>_>::insert
          (Table<const_void_*,_kj::HashIndex<kj::_::HashSetCallbacks>_> *this,Entry *row)

{
  long lVar1;
  Entry *pEVar2;
  size_t newSize;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,(Table<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry,_kj::HashIndex<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Callbacks>_>
                       *)this,*(long *)(this + 8) - *(long *)this >> 3,row,0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    lVar1 = *(long *)(this + 0x10);
    if (*(long *)(this + 8) == lVar1) {
      newSize = 4;
      if (lVar1 != *(long *)this) {
        newSize = lVar1 - *(long *)this >> 2;
      }
      Vector<const_void_*>::setCapacity((Vector<const_void_*> *)this,newSize);
    }
    **(unsigned_long **)(this + 8) = row->key;
    pEVar2 = *(Entry **)(this + 8);
    *(InterfaceSchema **)(this + 8) = &pEVar2->value;
    return pEVar2;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}